

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reassembly.c
# Opt level: O0

int la_reasm_payload_get(la_reasm_table *rtable,void *msg_info,uint8_t **result)

{
  void *__ptr;
  void *pvVar1;
  la_hash *key;
  la_list *l_00;
  undefined8 *in_RDX;
  char *in_RSI;
  long in_RDI;
  char *unaff_retaddr;
  la_reasm_fragment *fragment;
  la_list *l;
  uint8_t *ptr;
  uint8_t *reasm_buf;
  la_reasm_table_entry *rt_entry;
  size_t result_len;
  void *tmp_key;
  void *in_stack_ffffffffffffffb0;
  void *pvVar2;
  la_hash *in_stack_ffffffffffffffb8;
  la_hash *h;
  int iVar3;
  
  __ptr = (void *)(**(code **)(in_RDI + 0x18))(in_RSI);
  iVar3 = (int)((ulong)in_RDI >> 0x20);
  pvVar1 = la_hash_lookup(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (pvVar1 == (void *)0x0) {
    iVar3 = -1;
  }
  else if (*(int *)((long)pvVar1 + 4) < 1) {
    iVar3 = 0;
  }
  else {
    key = (la_hash *)la_xcalloc((size_t)l,(size_t)fragment,unaff_retaddr,iVar3,in_RSI);
    h = key;
    for (l_00 = *(la_list **)((long)pvVar1 + 0x38); l_00 != (la_list *)0x0;
        l_00 = la_list_next(l_00)) {
      pvVar2 = l_00->data;
      if ((*(long *)((long)pvVar2 + 8) != 0) && (*(long *)((long)pvVar2 + 0x10) != 0)) {
        memcpy(key,*(void **)((long)pvVar2 + 8),*(size_t *)((long)pvVar2 + 0x10));
      }
      key = (la_hash *)((long)key->buckets + *(long *)((long)pvVar2 + 0x10) + -0x20);
    }
    *(undefined1 *)((long)h->buckets + (long)*(int *)((long)pvVar1 + 4) + -0x20) = 0;
    *in_RDX = h;
    iVar3 = *(int *)((long)pvVar1 + 4);
    la_hash_remove(h,key);
  }
  free(__ptr);
  return iVar3;
}

Assistant:

int la_reasm_payload_get(la_reasm_table *rtable, void const *msg_info, uint8_t **result) {
	la_assert(rtable != NULL);
	la_assert(msg_info != NULL);
	la_assert(result != NULL);

	void *tmp_key = rtable->funcs.get_tmp_key(msg_info);
	la_assert(tmp_key);

	size_t result_len = -1;
	la_reasm_table_entry *rt_entry = la_hash_lookup(rtable->fragment_table, tmp_key);
	if(rt_entry == NULL) {
		result_len = -1;
		goto end;
	}
	if(rt_entry->frags_collected_total_len < 1) {
		result_len = 0;
		goto end;
	}
	// Append a NULL byte at the end of the reassembled buffer, so that it can be
	// cast to char * if this is a text message.
	uint8_t *reasm_buf = LA_XCALLOC(rt_entry->frags_collected_total_len + 1, sizeof(uint8_t));
	uint8_t *ptr = reasm_buf;
	for(la_list *l = rt_entry->fragment_list; l != NULL; l = la_list_next(l)) {
		la_reasm_fragment *fragment = l->data;
		if(fragment->payload.buf != NULL && fragment->payload.len > 0) {
			memcpy(ptr, fragment->payload.buf, fragment->payload.len);
		}
		ptr += fragment->payload.len;
	}
	reasm_buf[rt_entry->frags_collected_total_len] = '\0'; // buffer len is frags_collected_total_len + 1
	*result = reasm_buf;
	result_len = rt_entry->frags_collected_total_len;
	la_hash_remove(rtable->fragment_table, tmp_key);
end:
	LA_XFREE(tmp_key);
	return result_len;
}